

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_ArenaIncRef_Test::~ArenaTest_ArenaIncRef_Test
          (ArenaTest_ArenaIncRef_Test *this)

{
  ArenaTest_ArenaIncRef_Test *this_local;
  
  ~ArenaTest_ArenaIncRef_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, ArenaIncRef) {
  upb_Arena* arena1 = upb_Arena_New();
  EXPECT_EQ(upb_Arena_DebugRefCount(arena1), 1);
  upb_Arena_IncRefFor(arena1, nullptr);
  EXPECT_EQ(upb_Arena_DebugRefCount(arena1), 2);
  upb_Arena_DecRefFor(arena1, nullptr);
  EXPECT_EQ(upb_Arena_DebugRefCount(arena1), 1);
  upb_Arena_Free(arena1);
}